

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O1

void __thiscall SocketReceiveMultiplexer::Implementation::Implementation(Implementation *this)

{
  int iVar1;
  runtime_error *this_00;
  
  (this->timerListeners_).
  super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->timerListeners_).
  super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->socketListeners_).
  super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->timerListeners_).
  super__Vector_base<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->socketListeners_).
  super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->socketListeners_).
  super__Vector_base<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar1 = pipe(this->breakPipe_);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"creation of asynchronous break pipes failed\n");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Implementation()
	{
		if( pipe(breakPipe_) != 0 )
			throw std::runtime_error( "creation of asynchronous break pipes failed\n" );
	}